

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_pslld_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  if (0x1f < s->_q_ZMMReg[0]) {
    d->_q_ZMMReg[0] = 0;
    d->_q_ZMMReg[1] = 0;
    return;
  }
  d->_l_ZMMReg[0] = d->_l_ZMMReg[0] << (int)s->_q_ZMMReg[0];
  d->_l_ZMMReg[1] = d->_l_ZMMReg[1];
  d->_l_ZMMReg[2] = d->_l_ZMMReg[2];
  d->_l_ZMMReg[3] = d->_l_ZMMReg[3];
  return;
}

Assistant:

void glue(helper_pslld, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift;

    if (s->Q(0) > 31) {
        d->Q(0) = 0;
#if SHIFT == 1
        d->Q(1) = 0;
#endif
    } else {
        shift = s->B(0);
        d->L(0) <<= shift;
        d->L(1) <<= shift;
#if SHIFT == 1
        d->L(2) <<= shift;
        d->L(3) <<= shift;
#endif
    }
}